

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureAlloc.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::FillTexPitchAndSize
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_GFX_SIZE_T WidthBytesPhysical,
          uint32_t Height,__GMM_BUFFER_TYPE *pBufferType)

{
  GMM_TILE_MODE GVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  anon_struct_8_44_94931171_for_Info aVar5;
  GMM_TEXTURE_CALC *pGVar6;
  anon_struct_8_45_9b07292e_for_Gpu aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint8_t uVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  GMM_PLATFORM_INFO *pGVar14;
  long lVar15;
  uint uVar16;
  uint32_t uVar17;
  ulong uVar18;
  GMM_STATUS GVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  GMM_STATUS GVar23;
  long lVar24;
  GMM_GFX_SIZE_T WidthBytesRender;
  GMM_GFX_SIZE_T local_40;
  GMM_GFX_SIZE_T WidthBytesLock;
  GMM_GFX_SIZE_T WidthBytesPhysical_local;
  
  if (pBufferType == (__GMM_BUFFER_TYPE *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  pGVar14 = GmmGetPlatformInfo(this->pGmmLibContext);
  uVar20 = (ulong)pBufferType->MinPitch;
  if (pBufferType->MinPitch < WidthBytesPhysical) {
    uVar20 = WidthBytesPhysical;
  }
  GVar1 = pTexInfo->TileMode;
  if (0x6c < (int)GVar1) {
    return GMM_ERROR;
  }
  if (pGVar14->TileInfo[GVar1].LogicalSize == 0) {
    *(byte *)&pTexInfo->LegacyFlags = (byte)pTexInfo->LegacyFlags | 0x10;
    uVar21 = (ulong)(pBufferType->PitchAlignment - 1);
    local_40 = ~uVar21 & uVar20 + uVar21;
  }
  else {
    aVar5 = (pTexInfo->Flags).Info;
    uVar22 = 8;
    if (((((ulong)aVar5 & 0x7000000000) != 0) || (uVar22 = 4, ((ulong)aVar5 & 0x800000000) != 0)) ||
       (uVar22 = 2, ((ulong)aVar5 >> 0x22 & 1) != 0)) {
      pTexInfo->LegacyFlags = pTexInfo->LegacyFlags | uVar22;
    }
    uVar2 = pGVar14->TileInfo[GVar1].LogicalTileHeight;
    uVar21 = (ulong)(pGVar14->TileInfo[GVar1].LogicalTileWidth - 1);
    WidthBytesLock = ~uVar21 & uVar20 + uVar21;
    if ((((ulong)aVar5 & 0x104000000000) == 0 && ((ulong)aVar5 & 0x20100000) != 0) &&
       (((this->pGmmLibContext->SkuTable).field_1.field_0x3 & 2) == 0)) {
      uVar20 = (ulong)(pGVar14->TileInfo[GVar1].LogicalTileWidth * 4 - 1);
      WidthBytesLock = ~uVar20 & WidthBytesLock + uVar20;
    }
    local_40 = WidthBytesLock;
    pGVar6 = this->pGmmLibContext->pTextureCalc;
    (*pGVar6->_vptr_GmmTextureCalc[0x1e])(pGVar6,pTexInfo);
    if ((pBufferType->NeedPow2LockAlignment != '\0') && (local_40 = 1, 1 < (long)WidthBytesLock)) {
      lVar24 = 0x3f;
      if (WidthBytesLock - 1 != 0) {
        for (; WidthBytesLock - 1 >> lVar24 == 0; lVar24 = lVar24 + -1) {
        }
      }
      local_40 = 0;
      if (((uint)lVar24 ^ 1) < 0x3e) {
        local_40 = 1L << (-((byte)lVar24 ^ 0x3f) & 0x3f);
      }
    }
    uVar20 = (ulong)(pBufferType->LockPitchAlignment - 1);
    local_40 = ~uVar20 & local_40 + uVar20;
    Height = (Height - 1) + uVar2 & -uVar2;
    if ((((((this->pGmmLibContext->WaTable).field_0x7 & 2) != 0) &&
         ((pTexInfo->MSAA).NumSamples == 8)) &&
        ((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x810) != 0)) &&
       (((ulong)(pTexInfo->Flags).Gpu & 0x40) != 0)) {
      local_40 = local_40 + 0xff & 0xffffffffffffff00;
    }
  }
  pTexInfo->Pitch = local_40;
  aVar5 = (pTexInfo->Flags).Info;
  if ((((ulong)aVar5 & 1) != 0) && (pTexInfo->OverridePitch != 0)) {
    pTexInfo->Pitch = pTexInfo->OverridePitch;
  }
  if (((((this->pGmmLibContext->WaTable).field_0x8 & 0x40) != 0) &&
      (((pTexInfo->Flags).Gpu.field_0x4 & 0x20) != 0)) && (0xf00 < pTexInfo->BaseWidth)) {
    uVar20 = (ulong)(pGVar14->TileInfo[pTexInfo->TileMode].LogicalTileWidth * 4 - 1);
    pTexInfo->Pitch = ~uVar20 & pTexInfo->Pitch + uVar20;
  }
  if (((((uint)(this->pGmmLibContext->SkuTable).field_3 & 1) != 0) &&
      ((*(ulong *)&(this->pGmmLibContext->WaTable).field_0x4 & 0x10000000000) != 0)) &&
     (aVar7 = (pTexInfo->Flags).Gpu, ((ulong)aVar5 & 0x10000080000) == 0x80000 && aVar7._0_1_ < '\0'
     )) {
    if ((aVar7._0_4_ >> 8 & 1) == 0) {
      pTexInfo->Pitch = pTexInfo->Pitch + 0x1ff & 0xfffffffffffffe00;
    }
    else {
      (pTexInfo->Flags).Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)aVar7 & 0xffffffffffffff7f | (ulong)((pTexInfo->Pitch & 0x1ff) == 0) << 7);
    }
  }
  aVar7 = (pTexInfo->Flags).Gpu;
  if (((~(ulong)aVar7 & 0x20000000082) == 0) && (0xb < (int)(pGVar14->Platform).eRenderCoreFamily))
  {
    uVar20 = (ulong)(pGVar14->TileInfo[pTexInfo->TileMode].LogicalTileWidth << 3);
    if (pTexInfo->Pitch < uVar20) {
      uVar20 = pTexInfo->Pitch;
    }
    pTexInfo->Pitch = uVar20;
  }
  GVar19 = GMM_SUCCESS;
  if (((ulong)aVar7 & 0x20000000002) == 0x20000000002) {
    GVar19 = (GMM_STATUS)
             ((ulong)(pGVar14->TileInfo[pTexInfo->TileMode].LogicalTileWidth *
                     (pGVar14->TexAlign).CCS.MaxPitchinTiles) < pTexInfo->Pitch);
  }
  if (((this->pGmmLibContext->WaTable).field_0xa & 0x40) != 0) {
    uVar10 = GmmIsPlanar(pTexInfo->Format);
    if (((uVar10 == '\0') || (pTexInfo->Format == GMM_FORMAT_RGBP)) ||
       (bVar11 = true, pTexInfo->Format == GMM_FORMAT_BGRP)) {
      uVar10 = GmmIsYUVPacked(pTexInfo->Format);
      if (uVar10 == '\0') {
        bVar11 = false;
      }
      else {
        bVar11 = pTexInfo->Format != GMM_FORMAT_UYVY_2x1 && pTexInfo->Format != GMM_FORMAT_YVYU_2x1;
      }
    }
    if ((((pTexInfo->Flags).Info.field_0x5 & 8) != 0) &&
       (bVar11 || pTexInfo->Format - GMM_FORMAT_YCRCB_NORMAL < 4)) {
      uVar20 = CONCAT44(0,pGVar14->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar20;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = pTexInfo->Pitch;
      if ((auVar9 / auVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pTexInfo->Pitch = pTexInfo->Pitch + uVar20;
      }
    }
  }
  if (((((this->pGmmLibContext->WaTable).field_0x8 & 0x80) != 0) &&
      (((pTexInfo->Format == GMM_FORMAT_NV12 ||
        (uVar10 = GmmIsP0xx(pTexInfo->Format), uVar10 != '\0')) &&
       (((ulong)(pTexInfo->Flags).Info & 0x10000080000) == 0x80000)))) &&
     ((pTexInfo->Type == RESOURCE_PRIMARY || (((ulong)(pTexInfo->Flags).Gpu & 0x80) != 0)))) {
    aVar7 = (pTexInfo->Flags).Gpu;
    if ((aVar7._0_4_ >> 8 & 1) == 0) {
      pTexInfo->Pitch = pTexInfo->Pitch + 0xfff & 0xfffffffffffff000;
    }
    else {
      (pTexInfo->Flags).Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)aVar7 & 0xffffffffffffff7f | (ulong)((pTexInfo->Pitch & 0xfff) == 0) << 7);
    }
  }
  if (0x4f7 < (int)(pGVar14->Platform).eProductFamily) {
    (pTexInfo->OffsetInfo).field_0.Texture2DOffsetInfo.Offset[0xe] = pTexInfo->Pitch;
  }
  aVar7 = (pTexInfo->Flags).Gpu;
  uVar22 = aVar7._0_4_;
  if ((uVar22 >> 0x18 & 1) == 0) {
    uVar21 = (ulong)Height * pTexInfo->Pitch;
    uVar20 = uVar21;
    if ((pTexInfo->Type == RESOURCE_3D) && (((pTexInfo->Flags).Info.field_0x2 & 8) == 0)) {
      uVar20 = pGVar14->TileInfo[pTexInfo->TileMode].LogicalTileDepth * uVar21;
    }
    aVar5 = (pTexInfo->Flags).Info;
    if (((ulong)aVar5 & 0x106000000000) != 0) {
      uVar13 = (pTexInfo->MSAA).NumSamples;
      uVar18 = (ulong)uVar13;
      if (((ulong)aVar7 & 0x20000040) == 0 && 1 < uVar18) {
        if (((((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) &&
            (((ulong)(this->pGmmLibContext->SkuTable).field_1 & 0x800000000) == 0)) &&
           ((uVar18 == 0x10 || (uVar13 == 8)))) {
          uVar20 = uVar21 * 4;
        }
        else {
          uVar20 = uVar20 * uVar18;
        }
      }
    }
    uVar21 = uVar20 + 0xffff & 0xffffffffffff0000;
    if (((ulong)aVar5 & 0x1000000000) == 0) {
      uVar21 = uVar20;
    }
    if (((ulong)aVar7 & 0x800000000) == 0) {
      uVar21 = uVar20;
    }
    uVar18 = uVar21 + 0xff & 0xffffffffffffff00;
    if (((this->pGmmLibContext->SkuTable).field_1.field_0x4 & 4) == 0) {
      uVar18 = uVar21;
    }
    if ((aVar5._0_4_ >> 0x13 & 1) == 0) {
      uVar18 = uVar21;
    }
    if ((((pTexInfo->Type == RESOURCE_BUFFER) &&
         (((this->pGmmLibContext->WaTable).field_0x6 & 4) != 0)) &&
        (((ulong)aVar7 & 0xc0400200) == 0 && ((ulong)aVar5 & 0x20) == 0)) &&
       (((uint)(pTexInfo->Flags).Wa & 8) == 0)) {
      uVar20 = (ulong)(10 < (int)(pGVar14->Platform).eRenderCoreFamily) * 0x1000;
      uVar18 = ~(uVar20 | 0xfff) & uVar20 + 0xfff + uVar18 | 0x10;
    }
    uVar20 = uVar18 + 8;
    if ((~uVar22 & 0x1400) != 0) {
      uVar20 = uVar18;
    }
    if (((((ulong)aVar5 & 0x20) == 0) || ((pTexInfo->ExistingSysMem).IsGmmAllocated != '\0')) ||
       ((pTexInfo->ExistingSysMem).IsPageAligned != '\0')) {
      uVar20 = uVar20 + 0xfff & 0xfffffffffffff000;
    }
  }
  else {
    if (((uint)(this->pGmmLibContext->SkuTable).field_5 & 2) == 0) {
      uVar2 = pTexInfo->BaseHeight;
      iVar3 = (int)pTexInfo->Pitch;
      uVar17 = (pTexInfo->S3d).NumBlankActiveLines;
      iVar12 = (pTexInfo->S3d).DisplayModeHeight + uVar17;
      (pTexInfo->S3d).BlankAreaOffset = uVar2 * iVar3;
      (pTexInfo->S3d).RFrameOffset = iVar3 * iVar12;
      if ((uVar22 >> 0x19 & 1) != 0) {
        uVar4 = pGVar14->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        Height = -uVar4 & (uVar4 - 1) + uVar17 + uVar2 * 2;
        uVar13 = Height;
        goto LAB_001ba41f;
      }
      if ((uVar22 >> 0x13 & 1) != 0) {
        Height = iVar12 + uVar2;
        uVar13 = Height;
        goto LAB_001ba41f;
      }
      if (aVar7._0_1_ < '\0') {
        uVar13 = uVar17 + uVar2 * 2;
        goto LAB_001ba41f;
      }
    }
    else {
      (pTexInfo->S3d).BlankAreaOffset = 0;
      uVar13 = Height;
      if (((uVar22 >> 0x19 & 1) == 0) || (pTexInfo->ArraySize != 2)) {
        if ((uVar22 >> 0x13 & 1) == 0) {
          if (-1 < aVar7._0_1_) goto LAB_001ba425;
          (pTexInfo->S3d).RFrameOffset = 0;
        }
        else {
          (pTexInfo->S3d).RFrameOffset = (int)pTexInfo->Pitch * Height;
          Height = Height * 2;
          uVar13 = Height;
        }
      }
      else {
        (pTexInfo->S3d).RFrameOffset = (pTexInfo->Alignment).QPitch * (int)pTexInfo->Pitch;
      }
LAB_001ba41f:
      (pTexInfo->S3d).TallBufferHeight = uVar13;
    }
LAB_001ba425:
    uVar20 = (ulong)Height * pTexInfo->Pitch;
    (pTexInfo->S3d).TallBufferSize = (int)pTexInfo->Pitch * (pTexInfo->S3d).TallBufferHeight;
  }
  lVar24 = 0x10000000000;
  lVar15 = 0x968;
  if (((uVar22 >> 0x12 & 1) != 0) || (lVar15 = 14000, ((ulong)aVar7 & 0x800000000) == 0)) {
    lVar24 = *(long *)((long)&(pGVar14->Platform).eProductFamily + lVar15);
  }
  GVar23 = GMM_ERROR;
  if ((long)uVar20 <= lVar24) {
    pTexInfo->Size = uVar20;
    GVar23 = GVar19;
  }
  uVar13 = (pTexInfo->Alignment).BaseAlignment;
  uVar16 = pBufferType->Alignment;
  if ((uVar13 != 0) && (uVar16 % uVar13 != 0)) {
    GVar19 = GVar23;
    if ((uVar13 % uVar16 == 0) ||
       (GVar19 = GMM_ERROR, (int)((ulong)uVar13 * (ulong)uVar16 >> 0x20) != 0)) goto LAB_001ba4aa;
    uVar16 = uVar16 * uVar13;
  }
  (pTexInfo->Alignment).BaseAlignment = uVar16;
  GVar19 = GVar23;
LAB_001ba4aa:
  if (((((ulong)aVar7 & 0x1000000000) != 0) && (0xb < (int)(pGVar14->Platform).eRenderCoreFamily))
     || (((ulong)(pTexInfo->Flags).Info & 0x104008000000) != 0)) {
    uVar2 = (pTexInfo->Alignment).BaseAlignment;
    uVar17 = 0x10000;
    if ((short)uVar2 == 0) {
      uVar17 = uVar2;
    }
    (pTexInfo->Alignment).BaseAlignment = uVar17;
  }
  if (((uVar22 >> 0x10 & 1) != 0) &&
     ((*(ulong *)&(this->pGmmLibContext->WaTable).field_0x4 & 0x40000000000) != 0)) {
    (pTexInfo->Alignment).BaseAlignment = 0x400000;
  }
  return GVar19;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::FillTexPitchAndSize(GMM_TEXTURE_INFO * pTexInfo,
                                                       GMM_GFX_SIZE_T     WidthBytesPhysical,
                                                       uint32_t           Height,
                                                       __GMM_BUFFER_TYPE *pBufferType)
{
    GMM_STATUS     Status           = GMM_SUCCESS;
    GMM_GFX_SIZE_T WidthBytesRender = 0;
    GMM_GFX_SIZE_T WidthBytesLock   = 0;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pBufferType, GMM_ERROR);

    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    // Make sure that we meet the minimum HW requirment for that buffer type
    WidthBytesPhysical = GFX_MAX(WidthBytesPhysical, pBufferType->MinPitch);

    if(pTexInfo->TileMode >= GMM_TILE_MODES)
    {
        GMM_ASSERTDPF(0, "Invalid parameter!");
        return GMM_ERROR;
    }

    if(GMM_ISNOT_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        pTexInfo->LegacyFlags |= GMM_LINEAR;

        // For linear surace we need to make sure that physical pitch
        // meet the HW alignment (i.e DWORD or QWORD, ETC)
        WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical,
                                       pBufferType->PitchAlignment);

        WidthBytesRender = WidthBytesPhysical;
        WidthBytesLock   = WidthBytesPhysical;
    }
    else
    {
        if(pTexInfo->Flags.Info.TiledY ||
           pTexInfo->Flags.Info.TiledYf ||
           pTexInfo->Flags.Info.TiledYs)
        {
            pTexInfo->LegacyFlags |= GMM_TILE_Y;
        }
        else if(pTexInfo->Flags.Info.TiledX == 1)
        {
            pTexInfo->LegacyFlags |= GMM_TILE_X;
        }
        else if(pTexInfo->Flags.Info.TiledW == 1)
        {
            pTexInfo->LegacyFlags |= GMM_TILE_W;
        }

        // Align Height to tile height boundary
        Height = GFX_ALIGN(Height, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);

        // Align Width to next tile boundary
        WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical,
                                       pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth);

        if(pTexInfo->Flags.Info.RenderCompressed || pTexInfo->Flags.Info.MediaCompressed)
        {
            if(!GMM_IS_64KB_TILE(pTexInfo->Flags) && !pGmmLibContext->GetSkuTable().FtrFlatPhysCCS) //Ys is naturally aligned to required 4 YF pages
            {
                // Align Pitch to 4-tile boundary
                WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical,
                                               4 * pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
            }
        }

        // Calculate Alignment Restriction for rendering on the surface
        // NOTE:
        //  WidthBytesPhysical == true physical pitch used to determine amount
        //                        of Pages need for a surface
        //  WidthBytesRender == HW require pitch of a surface for rendering
        //                      (i.e. power2
        //  WidthBytesLock == Pitch when a surface is visible via Fence region.

        WidthBytesRender = WidthBytesLock = WidthBytesPhysical;

        // Align pitch to meet our HW requirment for each buffer
        WidthBytesRender = GFX_ALIGN(WidthBytesRender,
                                     pBufferType->RenderPitchAlignment);

        // Media Memory Compression : Allocate one memory tile wider than is required...
        pGmmLibContext->GetTextureCalc()->AllocateOneTileThanRequied(pTexInfo, WidthBytesRender,
                                                                        WidthBytesPhysical, WidthBytesLock);

        // check if locking a particular suface need to be power 2 or not
        if(pBufferType->NeedPow2LockAlignment)
        {
            WidthBytesLock = GFX_POW2_SIZE(WidthBytesPhysical);
        }

        // Align pitch to meet our HW requirment for each buffer
        // [1] 8K lock pitch is needed on Gen3 when we internally remap the
        //     display surface in GmmGetDisplayStartAddress ( ). Gen4,
        //     we don't remap due to Persurface tiling and stick to 64byte
        //     lock pitch alignment.
        WidthBytesLock = GFX_ALIGN(WidthBytesLock,
                                   pBufferType->LockPitchAlignment);

        if((pTexInfo->Type == RESOURCE_PRIMARY) || pTexInfo->Flags.Gpu.FlipChain)
        {
            // [2] At creation time, we tell OS the Render size, not
            //     SurfaceSizePhysical like other surfaces. Therefore, we change
            //     the SurfaceSizePhysical to match render size for simplicity.
            WidthBytesPhysical = WidthBytesRender;
        }

        if(pGmmLibContext->GetWaTable().WaMsaa8xTileYDepthPitchAlignment &&
           (pTexInfo->MSAA.NumSamples == 8) &&
           GMM_IS_4KB_TILE(pTexInfo->Flags) &&
           pTexInfo->Flags.Gpu.Depth)
        {
            WidthBytesLock =
            WidthBytesRender =
            WidthBytesPhysical = GFX_ALIGN(WidthBytesLock, GMM_BYTES(256));
        }
    }

    __GMM_ASSERT(WidthBytesLock == WidthBytesPhysical &&
                 WidthBytesRender == WidthBytesPhysical &&
                 WidthBytesLock == WidthBytesRender);
    pTexInfo->Pitch = WidthBytesLock;

    //VirtualPadding override
    if(pTexInfo->Flags.Info.AllowVirtualPadding &&
       pTexInfo->OverridePitch)
    {
        pTexInfo->Pitch = pTexInfo->OverridePitch;
    }

    // When lossless compression is enabled with plane width greater than 3840 and
    // horizontal panning, the surface pitch should be a multiple of 4 tiles. Since
    // GMM doesn't know about lossless compression status at allocation time, here
    // we apply the WA to all unified aux surfaces.
    if(pGmmLibContext->GetWaTable().WaLosslessCompressionSurfaceStride &&
       pTexInfo->Flags.Gpu.UnifiedAuxSurface &&
       (pTexInfo->BaseWidth > 3840))
    {
        pTexInfo->Pitch = GFX_ALIGN(pTexInfo->Pitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth * 4);
    }

    // If FBC is enabled with a linear surface, the surface pitch should be a multiple of
    // 8 cache lines (512 bytes). Since GMM doesn't know about FBC status, here we apply
    // the WA to all linear surfaces.
    // Xadapter surfaces has to be 128 Bytes aligned and hence we don't want this 512B alignment
    // for Xadapter. Eventually FBC will be disabled in case of Xadapter Linear surfaces
    if(pGmmLibContext->GetSkuTable().FtrFbc &&
       pGmmLibContext->GetWaTable().WaFbcLinearSurfaceStride &&
       pTexInfo->Flags.Gpu.FlipChain &&
       pTexInfo->Flags.Info.Linear &&
       !pTexInfo->Flags.Info.XAdapter)
    {
        if(pTexInfo->Flags.Gpu.FlipChainPreferred)
        {
            // Moderate down displayable flags if input parameters (.FlipChainPrefered)
            // deprioritise it, over Pitch alignement in this case.
            pTexInfo->Flags.Gpu.FlipChain = __GMM_IS_ALIGN(pTexInfo->Pitch, 512);
        }
        else
        {
            pTexInfo->Pitch = GFX_ALIGN(pTexInfo->Pitch, 512);
        }
    }

    // For CCS Aux Display Surf the surface stride should not exceed 8 times the LogicalTileWidth.
    if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs && pTexInfo->Flags.Gpu.FlipChain &&
       (GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE))
    {
        __GMM_ASSERT(pTexInfo->Pitch <= (pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth * 8));
        pTexInfo->Pitch = GFX_MIN(pTexInfo->Pitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth * 8);
    }

    if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs &&
       (pTexInfo->Pitch > pPlatform->TexAlign.CCS.MaxPitchinTiles * pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth))
    {
        GMM_ASSERTDPF(0, "Aux Surface pitch too large!");
        Status = GMM_ERROR;
    }
    
    if(pGmmLibContext->GetWaTable().Wa_15010089951)
    {
        // Default Tiling is set to Tile64 on FtrTileY disabled platforms
        uint8_t IsYUVSurface = ((GmmIsPlanar(pTexInfo->Format) &&
                                 (!((pTexInfo->Format == GMM_FORMAT_BGRP) || (pTexInfo->Format == GMM_FORMAT_RGBP)))) ||
                                (GmmIsYUVPacked(pTexInfo->Format) &&
                                 !((pTexInfo->Format == GMM_FORMAT_YVYU_2x1) || (pTexInfo->Format == GMM_FORMAT_UYVY_2x1) || (pTexInfo->Format == GMM_FORMAT_UYVY_2x1))));

        //YCRCB* formats
        uint8_t IsYCrCbSurface = ((pTexInfo->Format == GMM_FORMAT_YCRCB_NORMAL) ||
                                  (pTexInfo->Format == GMM_FORMAT_YCRCB_SWAPUV) ||
                                  (pTexInfo->Format == GMM_FORMAT_YCRCB_SWAPUVY) || (pTexInfo->Format == GMM_FORMAT_YCRCB_SWAPY));

        // Allocation needs to extend an extra tile in width when pitch is not an odd multiplication
        // of tile width which is 128 for Tile4 (YUV allocation is forced as Tile4).
        if(pTexInfo->Flags.Info.Tile4 && (IsYUVSurface || IsYCrCbSurface) &&
           ((pTexInfo->Pitch / (pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth)) % 2 == 0))
        {
            pTexInfo->Pitch = (pTexInfo->Pitch + (pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth));
        }
    }

    // For NV12 Linear FlipChain surfaces, UV plane distance should be 4k Aligned.
    // Hence make the stride to align to 4k, so that UV distance will be 4k aligned.
    if(pGmmLibContext->GetWaTable().Wa4kAlignUVOffsetNV12LinearSurface &&
       (pTexInfo->Format == GMM_FORMAT_NV12 || GmmIsP0xx(pTexInfo->Format)) && pTexInfo->Flags.Info.Linear &&
       (!pTexInfo->Flags.Info.XAdapter) &&
       ((pTexInfo->Type == RESOURCE_PRIMARY) || pTexInfo->Flags.Gpu.FlipChain))
    {
        if(pTexInfo->Flags.Gpu.FlipChainPreferred)
        {
            // Moderate down displayable flags if input parameters (.FlipChainPrefered)
            // deprioritise it, over Pitch alignement in this case.
            pTexInfo->Flags.Gpu.FlipChain = __GMM_IS_ALIGN(pTexInfo->Pitch, GMM_KBYTE(4));
        }
        else
        {
            pTexInfo->Pitch = GFX_ALIGN(pTexInfo->Pitch, GMM_KBYTE(4));
        }
    }

    if((GFX_GET_CURRENT_PRODUCT(pPlatform->Platform) >= IGFX_METEORLAKE))
    {
        pTexInfo->OffsetInfo.PlaneXe_LPG.PhysicalPitch = pTexInfo->Pitch;
    }

    { // Surface Sizes
        int64_t Size;

        if(pTexInfo->Flags.Gpu.S3d)
        {
            if(pGmmLibContext->GetSkuTable().FtrDisplayEngineS3d) // BDW+ Display Engine S3D (Tiled)
            {
                __GMM_ASSERT(!pTexInfo->Flags.Info.Linear);

                pTexInfo->S3d.BlankAreaOffset = 0;

                if(pTexInfo->Flags.Gpu.S3dDx && (pTexInfo->ArraySize == 2))
                {
                    pTexInfo->S3d.RFrameOffset     = GFX_ULONG_CAST(pTexInfo->Pitch * pTexInfo->Alignment.QPitch);
                    pTexInfo->S3d.TallBufferHeight = Height;
                }
                else
                {
                    if(pTexInfo->Flags.Gpu.Overlay)
                    {
                        pTexInfo->S3d.RFrameOffset = GFX_ULONG_CAST(pTexInfo->Pitch * Height);

                        Height = pTexInfo->S3d.TallBufferHeight = Height * 2;
                    }
                    else if(pTexInfo->Flags.Gpu.FlipChain)
                    {
                        pTexInfo->S3d.RFrameOffset     = 0;
                        pTexInfo->S3d.TallBufferHeight = Height;
                    }
                    else
                    {
                        // Something must be wrong. Not an S3D resource!
                        __GMM_ASSERT(0);
                    }
                }

                __GMM_ASSERT(__GMM_IS_ALIGN(pTexInfo->S3d.RFrameOffset, PAGE_SIZE));
            }
            else if(pTexInfo->Flags.Gpu.S3dDx) // DX S3D (Tiled)
            {
                __GMM_ASSERT(!pTexInfo->Flags.Info.Linear || !pTexInfo->Flags.Gpu.Overlay);
                __GMM_ASSERT(pTexInfo->ArraySize <= 1); // S3D framebuffer arrays are not supported (pre-BDW).

                pTexInfo->S3d.BlankAreaOffset = GFX_ULONG_CAST(pTexInfo->Pitch * pTexInfo->BaseHeight);

                pTexInfo->S3d.RFrameOffset =
                GFX_ULONG_CAST(pTexInfo->Pitch *
                               (pTexInfo->S3d.DisplayModeHeight + pTexInfo->S3d.NumBlankActiveLines));

                Height =
                pTexInfo->S3d.TallBufferHeight =
                GFX_ALIGN(
                (pTexInfo->BaseHeight * 2) + pTexInfo->S3d.NumBlankActiveLines,
                pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
            }
            else // Legacy S3D
            {
                __GMM_ASSERT(pTexInfo->Flags.Info.Linear);

                pTexInfo->S3d.BlankAreaOffset = GFX_ULONG_CAST(pTexInfo->Pitch * pTexInfo->BaseHeight);

                pTexInfo->S3d.RFrameOffset =
                GFX_ULONG_CAST(pTexInfo->Pitch *
                               (pTexInfo->S3d.DisplayModeHeight + pTexInfo->S3d.NumBlankActiveLines));

                if(pTexInfo->Flags.Gpu.Overlay)
                {
                    Height =
                    pTexInfo->S3d.TallBufferHeight =
                    pTexInfo->BaseHeight +
                    pTexInfo->S3d.NumBlankActiveLines +
                    pTexInfo->S3d.DisplayModeHeight;
                }
                else if(pTexInfo->Flags.Gpu.FlipChain)
                {
                    __GMM_ASSERT(pTexInfo->S3d.DisplayModeHeight == pTexInfo->BaseHeight);

                    pTexInfo->S3d.TallBufferHeight =
                    (pTexInfo->BaseHeight * 2) +
                    pTexInfo->S3d.NumBlankActiveLines;
                }
                else
                {
                    // Something must be wrong. Not an S3D resource!
                    __GMM_ASSERT(0);
                }

                __GMM_ASSERT(__GMM_IS_ALIGN(pTexInfo->S3d.RFrameOffset, PAGE_SIZE));
                __GMM_ASSERT(__GMM_IS_ALIGN(pTexInfo->S3d.BlankAreaOffset, PAGE_SIZE));
            }

            // Calculate surface size (physical).
            Size = pTexInfo->Pitch * Height;

            // Calculate tall buffer size (virtual).
            pTexInfo->S3d.TallBufferSize = GFX_ULONG_CAST(pTexInfo->Pitch * pTexInfo->S3d.TallBufferHeight);
        }
        else
        {
            Size = (int64_t)pTexInfo->Pitch * Height;

            if(pTexInfo->Type == RESOURCE_3D && !pTexInfo->Flags.Info.Linear)
            {
                Size *= pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileDepth;
            }

            if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
               (pTexInfo->MSAA.NumSamples > 1) &&
               (pTexInfo->Flags.Gpu.Depth == 0 && pTexInfo->Flags.Gpu.SeparateStencil == 0))
            {
                // For color buffer (meaning not depth or stencil buffer)
                // The width/height for TileYf/Ys MSAA surfaces are not expanded (using GmmExpandWidth/Height functions)
                // because pitch for these surfaces is in their non-expanded dimensions. So, the pitch
                // is also non-expanded units.  That's why, we multiply by the sample size here to get the correct size.
                if(pGmmLibContext->GetSkuTable().FtrTileY)
                {
                    Size *= pTexInfo->MSAA.NumSamples;
                }
                else
                {
                    //XeHP, DG2
                    if (!pGmmLibContext->GetSkuTable().FtrXe2PlusTiling && (pTexInfo->MSAA.NumSamples == 8 || pTexInfo->MSAA.NumSamples == 16))
                    {
                        uint64_t SliceSize = pTexInfo->Pitch * Height;
                        SliceSize *= 4; // multiple by samples per tile
                        Size = (int64_t)SliceSize;
                    }
                    else
                    {
                        Size *= pTexInfo->MSAA.NumSamples;
                    }
                }
            }

            if((pTexInfo->Flags.Info.TiledY && pTexInfo->Flags.Gpu.TiledResource))
            {
                //Pad align surface to 64KB ie Tile size
                Size = GFX_ALIGN(Size, GMM_KBYTE(64));
            }

            if (pGmmLibContext->GetSkuTable().FtrXe2Compression && pTexInfo->Flags.Info.Linear)
            {
                Size = GFX_ALIGN(Size, GMM_BYTES(256)); // for all linear resources starting Xe2, align overall size to compression block size. For subresources, 256B alignment is not needed, needed only for overall resource
                                                        // on older platforms, all linear resources get Halign = 128B which ensures overall size to be a multiple of compression block size of 128B,
                                                        // so this is needed only for linear resources on Xe2 where HAlign continues to be at 128B, but compression block size has doubled to 256B
            }

            // Buffer Sampler Padding...
            if((pTexInfo->Type == RESOURCE_BUFFER) &&
               pGmmLibContext->GetWaTable().WaNoMinimizedTrivialSurfacePadding &&
               !pTexInfo->Flags.Wa.NoBufferSamplerPadding &&
               !pTexInfo->Flags.Info.ExistingSysMem && // <-- Currently using separate padding WA in OCL (and rarity/luck in other UMD's).
               // <-- Never sampled from.
               !pTexInfo->Flags.Gpu.Query &&
               !pTexInfo->Flags.Gpu.HistoryBuffer &&
               !pTexInfo->Flags.Gpu.State &&
               !pTexInfo->Flags.Gpu.StateDx9ConstantBuffer)
            // These can be sampled from, so they need the padding...
            // pTexInfo->Flags.Gpu.Constant
            // pTexInfo->Flags.Gpu.Index
            // pTexInfo->Flags.Gpu.Stream
            // pTexInfo->Flags.Gpu.Vertex

            {
                uint32_t BufferSizeAlignment;
                uint32_t BufferSizePadding;

                // SURFTYPE_BUFFER's that can be sampled from must have their size
                // padded to a multiple of 256 buffer elements and then have an
                // additional 16 bytes of padding beyond that. Currently, the GMM
                // doesn't receive a buffer's element type/size, so (until that's
                // revamped) we'll assume the worst-case of 128-bit elements--which
                // means padding to 256 * 128 / 8 = 4KB and then adding 16 bytes.
                // In the case of BDW:A0, size is padded to a multiple of 512 buffer
                // elements instead of 256--which means padding to 8KB.

                BufferSizeAlignment =
                (GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN8_CORE) ?
                8192 :
                4096;

                BufferSizePadding = 16;

                Size = GFX_ALIGN(Size, BufferSizeAlignment) + BufferSizePadding;
            }

            // HiZ Clear Color requires some small data at the end of the allocation to
            // store the color data.
            if(pTexInfo->Flags.Gpu.HiZ && pTexInfo->Flags.Gpu.IndirectClearColor)
            {
                Size += GMM_HIZ_CLEAR_COLOR_SIZE;
            }

            if(pTexInfo->Flags.Info.ExistingSysMem &&
               !pTexInfo->ExistingSysMem.IsGmmAllocated &&
               !pTexInfo->ExistingSysMem.IsPageAligned)
            {
                // Do not modify Size
            }
            else
            {
                Size = GFX_ALIGN(Size, PAGE_SIZE);
            }
        }

        int64_t SurfaceMaxSize = 0;

        if(pTexInfo->Flags.Gpu.NoRestriction)
        {
            SurfaceMaxSize = pPlatform->NoRestriction.MaxWidth;
        }
        else if(pTexInfo->Flags.Gpu.TiledResource)
        {
            SurfaceMaxSize = GMM_TBYTE(1);
        }
        else
        {
            SurfaceMaxSize = pPlatform->SurfaceMaxSize;
        }

        if(Size <= SurfaceMaxSize)
        {
            pTexInfo->Size = Size;
        }
        else
        {
#if defined(__GMM_KMD__) || defined(__linux__)
            GMM_ASSERTDPF(0, "Surface too large!");
#endif
            Status = GMM_ERROR;
        }
    }

    {
        uint64_t TotalAlignment = (((uint64_t)((uint32_t)(pTexInfo->Alignment.BaseAlignment))) * ((uint32_t)(pBufferType->Alignment)));

        if(!pTexInfo->Alignment.BaseAlignment || __GMM_IS_ALIGN(pBufferType->Alignment, pTexInfo->Alignment.BaseAlignment))
        {
            pTexInfo->Alignment.BaseAlignment = pBufferType->Alignment;
        }
        else if(__GMM_IS_ALIGN(pTexInfo->Alignment.BaseAlignment, pBufferType->Alignment))
        {
            // Do nothing: pTexInfo->Alignment.BaseAlignment is properly alighned
        }
        else if(TotalAlignment > 0xFFFFFFFF)
        {
            GMM_ASSERTDPF(0, "Client requested alignment is too high, failing the allocation to match HW requiremnets. \r\n");
            Status = GMM_ERROR;
        }
        else
        {
            pTexInfo->Alignment.BaseAlignment = pTexInfo->Alignment.BaseAlignment * pBufferType->Alignment;
            GMM_ASSERTDPF(0,
                          "Client requested alignment that is not properly aligned to HW requirements."
                          "Alignment is going to be much higher to match both client and HW requirements.\r\n");
        }
    }

    if((pTexInfo->Flags.Gpu.TilePool && (GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE)) ||
       (pTexInfo->Flags.Info.Undefined64KBSwizzle) || GMM_IS_64KB_TILE(pTexInfo->Flags))
    {
        pTexInfo->Alignment.BaseAlignment = (GFX_IS_ALIGNED(pTexInfo->Alignment.BaseAlignment, GMM_KBYTE(64))) ? pTexInfo->Alignment.BaseAlignment : GMM_KBYTE(64);
    }

    if(pGmmLibContext->GetWaTable().WaCompressedResourceRequiresConstVA21 && pTexInfo->Flags.Gpu.MMC)
    {
        pTexInfo->Alignment.BaseAlignment = GMM_MBYTE(4);
    }

    GMM_DPF_EXIT;

    return (Status);
}